

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

nes_controller_state on_nes_input(int controller_id,void *client)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  long lVar13;
  nes_controller_state nVar14;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  nVar14 = (nes_controller_state)0x0;
  if (controller_id == 0) {
    lVar13 = SDL_GetKeyboardState(0);
    if (*(char *)(lVar13 + 0xe4) == '\0' && *(char *)(lVar13 + 0xe0) == '\0') {
      nVar14 = (nes_controller_state)
               ((*(byte *)(lVar13 + 0x28) & 1) << 4 |
               (*(byte *)(lVar13 + 0x2b) & 1) << 5 |
               (*(byte *)(lVar13 + 0xe) & 1) << 6 |
               *(char *)(lVar13 + 0xd) << 7 |
               *(byte *)(lVar13 + 7) & 1 |
               *(char *)(lVar13 + 4) * '\x02' & 2U |
               (*(byte *)(lVar13 + 0x16) & 1) << 2 | (*(byte *)(lVar13 + 0x1a) & 1) << 3);
    }
    if (controller[0] != (SDL_GameController *)0x0) {
      cVar2 = SDL_GameControllerGetButton(controller[0],0xb);
      cVar3 = SDL_GameControllerGetButton(controller[0],0xc);
      cVar4 = SDL_GameControllerGetButton(controller[0],0xd);
      bVar5 = SDL_GameControllerGetButton(controller[0],0xe);
      cVar6 = SDL_GameControllerGetButton(controller[0],0);
      cVar7 = SDL_GameControllerGetButton(controller[0],1);
      cVar8 = SDL_GameControllerGetButton(controller[0],4);
      uVar1 = (ulong)CONCAT22(CONCAT11(cVar6 << 7,bVar5 | (byte)nVar14),
                              CONCAT11(nVar14,cVar2 << 3 | (byte)nVar14)) & 0xffff80ff;
      cVar2 = SDL_GameControllerGetButton(controller[0],6);
      sVar9 = SDL_GameControllerGetAxis(controller[0],0);
      sVar10 = SDL_GameControllerGetAxis(controller[0],0);
      local_32 = (byte)(uVar1 >> 0x10);
      sVar11 = SDL_GameControllerGetAxis(controller[0],1);
      local_34 = (byte)uVar1;
      local_31 = (char)(uVar1 >> 0x18);
      local_33 = (byte)(uVar1 >> 8);
      sVar12 = SDL_GameControllerGetAxis(controller[0],1);
      nVar14 = (nes_controller_state)
               ((0x800 < sVar10 | local_32 & 1 |
                 (((cVar4 * '\x02' | (byte)nVar14) & 2) >> 1 | sVar9 < -0x800) * '\x02' |
                (cVar2 << 4 | (byte)nVar14) & 0x10 | (cVar8 << 5 | (byte)nVar14) & 0x20 |
                ((cVar7 << 6 | (byte)nVar14) & 0x40) + local_31 | local_33) +
                ((local_34 & 8) >> 3 | sVar11 < -0x800) * '\b' |
               (((cVar3 << 2 | (byte)nVar14) & 4) >> 2 | 0x800 < sVar12) << 2);
    }
  }
  return nVar14;
}

Assistant:

nes_controller_state on_nes_input(int controller_id, void* client)
{
    nes_controller_state state;
    memset(&state, 0, sizeof(nes_controller_state));

    if (controller_id == 0)
    {
        const uint8_t* keys = SDL_GetKeyboardState(0);
        int is_ctrl_down = keys[SDL_SCANCODE_LCTRL] | keys[SDL_SCANCODE_RCTRL];
        if (!is_ctrl_down)
        {
            state.up    = keys[SDL_SCANCODE_W];
            state.down  = keys[SDL_SCANCODE_S];
            state.left  = keys[SDL_SCANCODE_A];
            state.right = keys[SDL_SCANCODE_D];
            state.A     = keys[SDL_SCANCODE_J];
            state.B     = keys[SDL_SCANCODE_K];
            state.select = keys[SDL_SCANCODE_TAB];
            state.start  = keys[SDL_SCANCODE_RETURN];
        }

        if (controller[0])
        {
            state.up     |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_UP); 
            state.down   |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_DOWN); 
            state.left   |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_LEFT); 
            state.right  |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_DPAD_RIGHT); 
            state.A      |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_A); 
            state.B      |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_B); 
            state.select |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_BACK); 
            state.start  |= SDL_GameControllerGetButton(controller[0], SDL_CONTROLLER_BUTTON_START); 

            state.left  |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTX) < -CONTROLLER_DEADZONE;
            state.right |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTX) > CONTROLLER_DEADZONE;
            state.up    |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTY) < -CONTROLLER_DEADZONE;
            state.down  |= SDL_GameControllerGetAxis(controller[0], SDL_CONTROLLER_AXIS_LEFTY) > CONTROLLER_DEADZONE;
        }
    }

    return state;
}